

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(void)

{
  pointer *pppPVar1;
  int iVar2;
  time_t tVar3;
  PlayerMike_2 *pPVar4;
  vector<Player_*,_std::allocator<Player_*>_> players;
  Tournament t;
  PlayerMike_2 *local_d0;
  vector<Player_*,_std::allocator<Player_*>_> local_c8;
  Tournament local_b0;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Player **)0x0;
  local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Player **)0x0;
  pPVar4 = (PlayerMike_2 *)operator_new(0x30);
  pppPVar1 = &local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ROCK","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c7d0;
  pPVar4->m_histSize = 0;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x30);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"PAPER","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c7d0;
  pPVar4->m_histSize = 1;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x30);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"SCISSORS","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c7d0;
  pPVar4->m_histSize = 2;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x30);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CONST_2","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c848;
  iVar2 = rand();
  pPVar4->m_histSize = iVar2 % 3;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x30);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ALTERNATE","");
  PlayerAlternate::PlayerAlternate((PlayerAlternate *)pPVar4,(string *)&local_b0);
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x30);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CYCLE","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c8c8;
  iVar2 = rand();
  pPVar4->m_histSize = iVar2 % 3;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x30);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CYCLE_2","");
  PlayerCycle_2::PlayerCycle_2((PlayerCycle_2 *)pPVar4,(string *)&local_b0);
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x30);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CYCLE_3","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c948;
  iVar2 = rand();
  pPVar4->m_histSize = iVar2 % 3;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x30);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"COPY","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c988;
  pPVar4->m_histSize = 0;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x30);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"NEXT","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c9c8;
  pPVar4->m_histSize = 0;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x28);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"NEXT_2","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010ca08;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x30);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ANTI_NEXT","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010ca48;
  pPVar4->m_histSize = 0;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x38);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"RANDOM_DIST","");
  PlayerRandomDist::PlayerRandomDist((PlayerRandomDist *)pPVar4,(string *)&local_b0);
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x28);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"RANDOM","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010cac8;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x30);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"MIKE","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010cb08;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x38);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ASK","");
  PlayerAsk::PlayerAsk((PlayerAsk *)pPVar4,(string *)&local_b0);
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x60);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"MIKE_2","");
  PlayerMike_2::PlayerMike_2(pPVar4,(string *)&local_b0);
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x40);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"MIKE_3","");
  PlayerMike_3::PlayerMike_3((PlayerMike_3 *)pPVar4,(string *)&local_b0);
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x40);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"MIKE_4","");
  PlayerMike_4::PlayerMike_4((PlayerMike_4 *)pPVar4,(string *)&local_b0);
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x28);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"MADS","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010cc48;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x28);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"DELAY","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010cc88;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x40);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ANTI_MIKE","");
  PlayerAntiMike::PlayerAntiMike((PlayerAntiMike *)pPVar4,(string *)&local_b0);
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x28);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"DELAY_2","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010cd08;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x28);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"TERMINATOR","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010cd48;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar4 = (PlayerMike_2 *)operator_new(0x28);
  local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"DELAY_3","");
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (pPVar4->super_Player).m_name._M_dataplus._M_p = (pointer)&(pPVar4->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pPVar4->super_Player).m_name,
             local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
             (long)local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  (pPVar4->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010cd88;
  local_d0 = pPVar4;
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*>
              ((vector<Player*,std::allocator<Player*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Player **)&local_d0);
  }
  else {
    *local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Player *)pPVar4;
    local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppPVar1) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  Tournament::Tournament(&local_b0,&local_c8,1000);
  Tournament::play(&local_b0);
  Tournament::showTable(&local_b0);
  Tournament::show(&local_b0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_b0.m_biggest_competitor._M_h);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_b0.m_table);
  if (local_b0.m_totals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.m_totals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.m_players.super__Vector_base<Player_*,_std::allocator<Player_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
   srand(time(0));

   std::vector<Player *> players;

   players.push_back(new PlayerConst(     "ROCK",       0));
   players.push_back(new PlayerConst(     "PAPER",      1));
   players.push_back(new PlayerConst(     "SCISSORS",   2));
   players.push_back(new PlayerConst_2(   "CONST_2"      ));
   players.push_back(new PlayerAlternate( "ALTERNATE"    ));
   players.push_back(new PlayerCycle(     "CYCLE"        ));
   players.push_back(new PlayerCycle_2(   "CYCLE_2"      ));
   players.push_back(new PlayerCycle_3(   "CYCLE_3"      ));
   players.push_back(new PlayerCopy(      "COPY",       0));
   players.push_back(new PlayerNext(      "NEXT",       0));
   players.push_back(new PlayerNext_2(    "NEXT_2"       ));
   players.push_back(new PlayerAntiNext(  "ANTI_NEXT",  0));
   players.push_back(new PlayerRandomDist("RANDOM_DIST"  ));
   players.push_back(new PlayerRandom(    "RANDOM"       ));
   players.push_back(new PlayerMike(      "MIKE"         ));
   players.push_back(new PlayerAsk(       "ASK"          ));
   players.push_back(new PlayerMike_2(    "MIKE_2"       ));
   players.push_back(new PlayerMike_3(    "MIKE_3"       ));
   players.push_back(new PlayerMike_4(    "MIKE_4"       ));
   players.push_back(new PlayerMads(      "MADS"         ));
   players.push_back(new PlayerDelay(     "DELAY"        ));
   players.push_back(new PlayerAntiMike(  "ANTI_MIKE"    ));
   players.push_back(new PlayerDelay_2 (  "DELAY_2"      ));
   players.push_back(new PlayerTerminator("TERMINATOR"   ));
   players.push_back(new PlayerDelay_3(   "DELAY_3"      ));
   Tournament t(players, numGames);
   
   t.play();

   t.showTable();
   t.show();
}